

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed.cpp
# Opt level: O2

void __thiscall
iu_TypedTest_x_iutest_x_Equal_Test<int>::Body(iu_TypedTest_x_iutest_x_Equal_Test<int> *this)

{
  int *in_R9;
  TypeParam_conflict3 a;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  a = 0;
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 0;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x2028d0,"a",(char *)&local_190,&a,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/typed.cpp"
               ,0x1e,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedTest, Equal)
{
    TypeParam a = 0;
    IUTEST_ASSERT_EQ(0, a);
}